

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O1

void __thiscall hdc::PrettyPrinter::visit(PrettyPrinter *this,LogicalOrExpression *expression)

{
  TokenKind TVar1;
  Expression *pEVar2;
  char *pcVar3;
  Token local_50;
  
  pEVar2 = BinaryOperator::getLeft(&expression->super_BinaryOperator);
  (**(pEVar2->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar2,this);
  BinaryOperator::getOper(&local_50,&expression->super_BinaryOperator);
  TVar1 = Token::getKind(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.lexem._M_dataplus._M_p != &local_50.lexem.field_2) {
    operator_delete(local_50.lexem._M_dataplus._M_p);
  }
  pcVar3 = " || ";
  if (TVar1 == TK_OR) {
    pcVar3 = " or ";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->field_0x20,pcVar3,4);
  pEVar2 = BinaryOperator::getRight(&expression->super_BinaryOperator);
  (**(pEVar2->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar2,this);
  return;
}

Assistant:

void PrettyPrinter::visit(LogicalOrExpression *expression) {
    expression->getLeft()->accept(this);

    if (expression->getOper().getKind() == TK_OR) {
        output << " or ";
    } else {
        output << " || ";
    }

    expression->getRight()->accept(this);
}